

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void SVGChart::FindRange(PlotDataBase *inData,float inMin,float inMax,long *outStartIndex,
                        long *outEndIndex)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  long *outEndIndex_local;
  long *outStartIndex_local;
  float inMax_local;
  float inMin_local;
  PlotDataBase *inData_local;
  
  *outStartIndex = 0;
  while( true ) {
    lVar3 = *outStartIndex;
    lVar2 = PlotDataBase::GetSize(inData);
    bVar1 = false;
    if (lVar3 < lVar2) {
      fVar4 = PlotDataBase::GetValue(inData,*outStartIndex);
      bVar1 = fVar4 <= inMin;
    }
    if (!bVar1) break;
    *outStartIndex = *outStartIndex + 1;
  }
  lVar3 = *outStartIndex;
  lVar2 = PlotDataBase::GetSize(inData);
  if (lVar3 == lVar2) {
    lVar3 = PlotDataBase::GetSize(inData);
    *outStartIndex = lVar3 + -1;
    *outEndIndex = *outStartIndex;
    if (*outStartIndex < 0) {
      __assert_fail("outStartIndex>-1",
                    "/workspace/llm4binary/github/license_c_cmakelists/davecom[P]SVGChart/PPlot.cpp"
                    ,0x59e,
                    "void SVGChart::FindRange(const PlotDataBase &, float, float, long &, long &)");
    }
  }
  else {
    if (0 < *outStartIndex) {
      *outStartIndex = *outStartIndex + -1;
    }
    *outEndIndex = *outStartIndex;
    while( true ) {
      lVar3 = *outEndIndex;
      lVar2 = PlotDataBase::GetSize(inData);
      bVar1 = false;
      if (lVar3 < lVar2) {
        fVar4 = PlotDataBase::GetValue(inData,*outEndIndex);
        bVar1 = fVar4 < inMax;
      }
      if (!bVar1) break;
      *outEndIndex = *outEndIndex + 1;
    }
    lVar3 = *outEndIndex;
    lVar2 = PlotDataBase::GetSize(inData);
    if (lVar3 == lVar2) {
      *outEndIndex = *outEndIndex + -1;
    }
    if (*outStartIndex < 0) {
      __assert_fail("outStartIndex>-1",
                    "/workspace/llm4binary/github/license_c_cmakelists/davecom[P]SVGChart/PPlot.cpp"
                    ,0x5af,
                    "void SVGChart::FindRange(const PlotDataBase &, float, float, long &, long &)");
    }
  }
  return;
}

Assistant:

void FindRange (const PlotDataBase &inData, float inMin, float inMax, long& outStartIndex, long& outEndIndex) {
        outStartIndex = 0;
        while (outStartIndex < inData.GetSize () && inData.GetValue (outStartIndex) <= inMin) {
            outStartIndex++;
        }

        if (outStartIndex == inData.GetSize ()) {
            outStartIndex = inData.GetSize () - 1;
            outEndIndex = outStartIndex;
            assert (outStartIndex>-1);
            return;
        }

        // We want the value at outStartIndex smaller than or equal to inMin
        if (outStartIndex > 0) {
            outStartIndex--;
        }

        outEndIndex = outStartIndex;
        while (outEndIndex < inData.GetSize () && inData.GetValue (outEndIndex) < inMax) {
            outEndIndex++;
        }

        if (outEndIndex == inData.GetSize ()) {
            outEndIndex--;
        }
        assert (outStartIndex>-1);
    }